

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

QString * preprocessMetadata(QString *in)

{
  QArrayDataPointer<char16_t> *this;
  qsizetype qVar1;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  QString *out;
  char16_t *str_1;
  char16_t *str;
  QString l;
  QList<QString> lines;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  byte in_stack_fffffffffffffe9e;
  byte in_stack_fffffffffffffe9f;
  QFlags<Qt::SplitBehaviorFlags> *in_stack_fffffffffffffea0;
  QString *this_00;
  int local_138;
  QString *pQVar2;
  QLatin1Char local_eb [51];
  QArrayDataPointer<char16_t> local_b8 [3];
  QArrayDataPointer<char16_t> local_70 [2];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  QLatin1Char local_23 [3];
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  this_00 = in_RDI;
  pQVar2 = in_RDI;
  QLatin1Char::QLatin1Char(local_23,'\\');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffffea0,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            (in_stack_fffffffffffffea0,
             CONCAT13(in_stack_fffffffffffffe9f,
                      CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)));
  QString::split(in_RSI,(QChar)(char16_t)((ulong)pQVar2 >> 0x30),
                 (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)SUB84(pQVar2,0),
                 (CaseSensitivity)((ulong)in_RDI >> 0x20));
  (this_00->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (this_00->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (this_00->d).size = -0x5555555555555556;
  QString::QString((QString *)0x10b355);
  local_138 = 0;
  while( true ) {
    this = (QArrayDataPointer<char16_t> *)(long)local_138;
    qVar1 = QList<QString>::size(&local_20);
    if (qVar1 <= (long)this) break;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::at((QList<QString> *)this,
                       CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98))));
    QString::simplified((QString *)
                        CONCAT17(in_stack_fffffffffffffe9f,
                                 CONCAT16(in_stack_fffffffffffffe9e,
                                          CONCAT24(in_stack_fffffffffffffe9c,
                                                   in_stack_fffffffffffffe98))));
    qVar1 = QString::length((QString *)0x10b3e1);
    if (1 < qVar1) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_70,(Data *)0x0,L"\"",1);
      QString::QString((QString *)this,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98))));
      in_stack_fffffffffffffe9f =
           QString::startsWith(in_RDI,(QString *)this,
                               CONCAT13(in_stack_fffffffffffffe9f,
                                        CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c
                                                )));
      QString::~QString((QString *)0x10b472);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
      if ((in_stack_fffffffffffffe9f & 1) != 0) {
        QString::length((QString *)0x10b496);
        QString::right(this_00,(qsizetype)in_RSI);
        QString::operator=((QString *)this,
                           (QString *)
                           CONCAT17(in_stack_fffffffffffffe9f,
                                    CONCAT16(in_stack_fffffffffffffe9e,
                                             CONCAT24(in_stack_fffffffffffffe9c,
                                                      in_stack_fffffffffffffe98))));
        QString::~QString((QString *)0x10b4d4);
      }
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_b8,(Data *)0x0,L"\"",1);
      QString::QString((QString *)this,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffe9f,
                                CONCAT16(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98))));
      in_stack_fffffffffffffe9e =
           QString::endsWith(in_RDI,(QString *)this,
                             CONCAT13(in_stack_fffffffffffffe9f,
                                      CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c))
                            );
      QString::~QString((QString *)0x10b552);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(this);
      if ((in_stack_fffffffffffffe9e & 1) != 0) {
        QString::length((QString *)0x10b576);
        QString::left(this_00,(qsizetype)in_RSI);
        QString::operator=((QString *)this,
                           (QString *)
                           CONCAT17(in_stack_fffffffffffffe9f,
                                    CONCAT16(in_stack_fffffffffffffe9e,
                                             CONCAT24(in_stack_fffffffffffffe9c,
                                                      in_stack_fffffffffffffe98))));
        QString::~QString((QString *)0x10b5b4);
      }
      QString::simplified((QString *)
                          CONCAT17(in_stack_fffffffffffffe9f,
                                   CONCAT16(in_stack_fffffffffffffe9e,
                                            CONCAT24(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98))));
      QString::operator=((QString *)this,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffe9f,
                                  CONCAT16(in_stack_fffffffffffffe9e,
                                           CONCAT24(in_stack_fffffffffffffe9c,
                                                    in_stack_fffffffffffffe98))));
      QString::~QString((QString *)0x10b5eb);
      qVar1 = QString::length((QString *)0x10b5f8);
      if (1 < qVar1) {
        qVar1 = QString::size(this_00);
        if (0 < qVar1) {
          QLatin1Char::QLatin1Char(local_eb,'\n');
          QChar::QChar<QLatin1Char,_true>((QChar *)this,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
          QString::append(in_RSI,(QChar)(char16_t)((ulong)this_00 >> 0x30));
        }
        QString::append(in_RDI,(QString *)this);
      }
    }
    QString::~QString((QString *)0x10b662);
    local_138 = local_138 + 1;
  }
  QList<QString>::~QList((QList<QString> *)0x10b6ab);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString preprocessMetadata(const QString &in)
{
    DEBUGPRINTF(printf("in: %s\n", qPrintable(in)));
    QList<QString> lines = in.split(QLatin1Char('\\'));
    QString out;
    for (int i = 0; i < lines.size(); i++) {
        QString l = lines.at(i).simplified();
        DEBUGPRINTF(printf("line: %s\n", qPrintable(l)));
        if (l.length() < 2)
            continue;
        if (l.startsWith(QStringLiteral("\"")))
            l = l.right(l.length() - 1);
        if (l.endsWith(QStringLiteral("\"")))
            l = l.left(l.length() - 1);
        l = l.simplified();

        if (l.length() > 1) {
            if (out.size() > 0)
                out.append(QLatin1Char('\n'));
            out.append(l);
        }
    }
    DEBUGPRINTF(printf("out: %s\n", qPrintable(out)));
    return out;
}